

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int x509_profile_check_key
              (mbedtls_x509_crt_profile *profile,mbedtls_pk_type_t pk_alg,mbedtls_pk_context *pk)

{
  size_t sVar1;
  
  if (pk_alg != MBEDTLS_PK_RSASSA_PSS) {
    if (pk_alg == MBEDTLS_PK_ECDSA) {
      return ((profile->allowed_curves >> ((byte)(*pk->pk_ctx - 1) & 0x1f) & 1) != 0) - 1;
    }
    if (pk_alg != MBEDTLS_PK_RSA) {
      return -1;
    }
  }
  sVar1 = mbedtls_pk_get_bitlen(pk);
  return -(uint)(sVar1 < profile->rsa_min_bitlen);
}

Assistant:

static int x509_profile_check_key( const mbedtls_x509_crt_profile *profile,
                                   mbedtls_pk_type_t pk_alg,
                                   const mbedtls_pk_context *pk )
{
#if defined(MBEDTLS_RSA_C)
    if( pk_alg == MBEDTLS_PK_RSA || pk_alg == MBEDTLS_PK_RSASSA_PSS )
    {
        if( mbedtls_pk_get_bitlen( pk ) >= profile->rsa_min_bitlen )
            return( 0 );

        return( -1 );
    }
#endif

#if defined(MBEDTLS_ECDSA_C)
    if( pk_alg == MBEDTLS_PK_ECDSA )
    {
        mbedtls_ecp_group_id gid = mbedtls_pk_ec( *pk )->grp.id;

        if( ( profile->allowed_curves & MBEDTLS_X509_ID_FLAG( gid ) ) != 0 )
            return( 0 );

        return( -1 );
    }
#endif

    return( -1 );
}